

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_4x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  char cVar2;
  int8_t *piVar3;
  int iVar4;
  int iVar5;
  __m128i *in_00;
  byte in_CL;
  long in_RSI;
  __m128i *cur_in;
  int i;
  int lr_flip;
  int ud_flip;
  fwd_transform_1d_sse4_1 row_txfm;
  fwd_transform_1d_sse4_1 col_txfm;
  int bitrow;
  int bitcol;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i in [8];
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  __m128i *out;
  fwd_transform_1d_sse4_1 input_00;
  longlong local_a8 [4];
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  __m128i *in_stack_ffffffffffffff88;
  __m128i *in_stack_ffffffffffffff90;
  
  piVar3 = av1_fwd_txfm_shift_ls[5];
  iVar4 = get_txw_idx('\x05');
  iVar5 = get_txh_idx('\x05');
  cVar1 = av1_fwd_cos_bit_col[iVar4][iVar5];
  cVar2 = av1_fwd_cos_bit_row[iVar4][iVar5];
  input_00 = col_highbd_txfm4x8_arr[in_CL];
  out = (__m128i *)row_highbd_txfm4x4_arr[in_CL];
  get_flip_cfg(in_CL,(int *)&stack0xffffffffffffff24,(int *)&stack0xffffffffffffff20);
  load_buffer_4x8((int16_t *)input_00,out,in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                  in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
  (*input_00)((__m128i *)local_a8,(__m128i *)local_a8,(int)cVar1,1);
  col_txfm_4x8_rounding((__m128i *)local_a8,-(int)piVar3[1]);
  for (iVar4 = 0; iVar4 < 2; iVar4 = iVar4 + 1) {
    in_00 = (__m128i *)(local_a8 + (long)(iVar4 << 2) * 2);
    transpose_32bit_4x4(in_00,in_00);
    (*(code *)out)(in_00,in_00,(int)cVar2,1);
    av1_round_shift_rect_array_32_sse4_1
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    store_output_w4((int32_t *)(in_RSI + (long)(iVar4 << 2) * 4),in_00,8,4);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_4x8_sse4_1(const int16_t *input, int32_t *coeff, int stride,
                               TX_TYPE tx_type, int bd) {
  __m128i in[8];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X8];
  const int txw_idx = get_txw_idx(TX_4X8);
  const int txh_idx = get_txh_idx(TX_4X8);
  const int txfm_size_col = tx_size_wide[TX_4X8];
  const int txfm_size_row = tx_size_high[TX_4X8];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm4x8_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm4x4_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  load_buffer_4x8(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, in, bitcol, 1);
  col_txfm_4x8_rounding(in, -shift[1]);

  for (int i = 0; i < 2; i++) {
    __m128i *cur_in = &in[i * 4];
    transpose_32bit_4x4(cur_in, cur_in);
    row_txfm(cur_in, cur_in, bitrow, 1);
    av1_round_shift_rect_array_32_sse4_1(cur_in, cur_in, txfm_size_col,
                                         -shift[2], NewSqrt2);
    store_output_w4(coeff + i * 4, cur_in, txfm_size_row, 4);
  }
  (void)bd;
}